

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

void __thiscall
icu_63::HebrewCalendar::handleComputeFields
          (HebrewCalendar *this,int32_t julianDay,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  uint uVar3;
  long lVar4;
  short *psVar5;
  int iVar6;
  int year;
  int16_t (*paiVar7) [3];
  short *psVar8;
  short *psVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  iVar12 = julianDay + -0x54f5d;
  iVar6 = (int)(((((double)iVar12 * 25920.0) / 765433.0) * 19.0 + 234.0) / 235.0 + 1.0);
  iVar10 = iVar6 * 0xc + 0x1d;
  do {
    year = iVar6;
    iVar2 = startOfYear(year,status);
    iVar10 = iVar10 + -0xc;
    iVar11 = iVar12 - iVar2;
    iVar6 = year + -1;
  } while (iVar11 == 0 || iVar12 < iVar2);
  uVar3 = yearType(this,year);
  iVar10 = iVar10 % 0x13;
  iVar6 = 0xc;
  if (iVar10 < 0) {
    iVar6 = -7;
  }
  paiVar7 = LEAP_MONTH_START;
  psVar8 = (short *)((long)LEAP_MONTH_START[0] + (ulong)(uVar3 * 2));
  psVar5 = (short *)((long)MONTH_START[0] + (ulong)(uVar3 * 2));
  lVar4 = 0;
  do {
    if (lVar4 == -0xe) {
LAB_001fe543:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    psVar9 = psVar8;
    if (iVar10 < iVar6) {
      psVar9 = psVar5;
    }
    if (iVar11 <= *psVar9) {
      if (lVar4 != 0) {
        if (iVar10 < iVar6) {
          paiVar7 = MONTH_START;
        }
        sVar1 = paiVar7[~(uint)lVar4][uVar3];
        (this->super_Calendar).fFields[0] = 0;
        (this->super_Calendar).fStamp[0] = 1;
        (this->super_Calendar).fIsSet[0] = '\x01';
        (this->super_Calendar).fFields[1] = year;
        (this->super_Calendar).fStamp[1] = 1;
        (this->super_Calendar).fStamp[2] = 1;
        (this->super_Calendar).fIsSet[1] = '\x01';
        (this->super_Calendar).fIsSet[2] = '\x01';
        (this->super_Calendar).fFields[0x13] = year;
        (this->super_Calendar).fStamp[0x13] = 1;
        (this->super_Calendar).fIsSet[0x13] = '\x01';
        (this->super_Calendar).fFields[2] = ~(uint)lVar4;
        (this->super_Calendar).fFields[5] = iVar11 - sVar1;
        (this->super_Calendar).fStamp[5] = 1;
        (this->super_Calendar).fStamp[6] = 1;
        (this->super_Calendar).fIsSet[5] = '\x01';
        (this->super_Calendar).fIsSet[6] = '\x01';
        (this->super_Calendar).fFields[6] = iVar11;
        return;
      }
      goto LAB_001fe543;
    }
    lVar4 = lVar4 + -1;
    psVar8 = psVar8 + 3;
    psVar5 = psVar5 + 3;
  } while( true );
}

Assistant:

void HebrewCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t d = julianDay - 347997;
    double m = ((d * (double)DAY_PARTS)/ (double) MONTH_PARTS);         // Months (approx)
    int32_t year = (int32_t)( ((19. * m + 234.) / 235.) + 1.);     // Years (approx)
    int32_t ys  = startOfYear(year, status);                   // 1st day of year
    int32_t dayOfYear = (d - ys);

    // Because of the postponement rules, it's possible to guess wrong.  Fix it.
    while (dayOfYear < 1) {
        year--;
        ys  = startOfYear(year, status);
        dayOfYear = (d - ys);
    }

    // Now figure out which month we're in, and the date within that month
    int32_t type = yearType(year);
    UBool isLeap = isLeapYear(year);

    int32_t month = 0;
    int32_t momax = UPRV_LENGTHOF(MONTH_START);
    while (month < momax && dayOfYear > (  isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type] ) ) {
        month++;
    }
    if (month >= momax || month<=0) {
        // TODO: I found dayOfYear could be out of range when
        // a large value is set to julianDay.  I patched startOfYear
        // to reduce the chace, but it could be still reproduced either
        // by startOfYear or other places.  For now, we check
        // the month is in valid range to avoid out of array index
        // access problem here.  However, we need to carefully review
        // the calendar implementation to check the extreme limit of
        // each calendar field and the code works well for any values
        // in the valid value range.  -yoshito
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    month--;
    int dayOfMonth = dayOfYear - (isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type]);

    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}